

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_st.c
# Opt level: O1

err_t cmdStDo(u32 tests)

{
  bool_t bVar1;
  err_t eVar2;
  err_t eVar3;
  octet *poVar4;
  octet *poVar5;
  size_t pwd_len;
  octet oid [11];
  octet buf1 [16];
  char pwd [17];
  octet hash [32];
  octet privkey [32];
  octet buf [32];
  octet state [1024];
  octet local_648 [16];
  octet local_638 [64];
  ulong local_5f8;
  char acStack_5f0 [40];
  octet local_5c8 [32];
  octet local_5a8 [32];
  bign_params local_588;
  octet local_438 [1032];
  
  if ((tests & 0x1f) == 0) goto LAB_00108103;
  if ((tests & 1) == 0) {
LAB_00107a1c:
    if ((tests & 2) != 0) {
      poVar4 = beltH();
      eVar2 = belsShare3(local_438,5,3,0x20,poVar4);
      eVar3 = 0x20a;
      if ((eVar2 == 0) && (eVar2 = belsRecover2((octet *)&local_588,1,0x20,local_438), eVar2 == 0))
      {
        poVar4 = beltH();
        bVar1 = memEq(&local_588,poVar4,0x20);
        if ((bVar1 == 0) && (eVar2 = belsRecover2((octet *)&local_588,2,0x20,local_438), eVar2 == 0)
           ) {
          poVar4 = beltH();
          bVar1 = memEq(&local_588,poVar4,0x20);
          if ((bVar1 == 0) &&
             (eVar2 = belsRecover2((octet *)&local_588,3,0x20,local_438), eVar2 == 0)) {
            poVar4 = beltH();
            bVar1 = memEq(&local_588,poVar4,0x20);
            eVar3 = 0x20a;
            if (bVar1 != 0) {
              eVar3 = 0;
            }
          }
        }
      }
      if (eVar3 != 0) goto LAB_001080ff;
    }
    if ((tests & 4) != 0) {
      local_5f8._0_1_ = 'B';
      local_5f8._1_1_ = '1';
      local_5f8._2_1_ = '9';
      local_5f8._3_1_ = '4';
      local_5f8._4_1_ = 'B';
      local_5f8._5_1_ = 'A';
      local_5f8._6_1_ = 'C';
      local_5f8._7_1_ = '8';
      builtin_strncpy(acStack_5f0,"0A08F53B",9);
      poVar4 = beltH();
      memCopy(&local_588,poVar4,0x30);
      poVar4 = beltH();
      beltECBStart(local_438,poVar4 + 0x80,0x20);
      beltECBStepE(&local_588,0x10,local_438);
      bVar1 = hexEq(&local_588,"69CCA1C93557C9E3D66BC3E0FA88FA6E");
      eVar3 = 0x20a;
      if (bVar1 != 0) {
        poVar4 = beltH();
        memCopy(&local_588,poVar4 + 0x40,0x30);
        poVar4 = beltH();
        beltECBStart(local_438,poVar4 + 0xa0,0x20);
        beltECBStepD(&local_588,0x10,local_438);
        bVar1 = hexEq(&local_588,"0DC5300600CAB840B38448E5E993F421");
        if (bVar1 != 0) {
          poVar4 = beltH();
          poVar5 = beltH();
          beltMAC((octet *)&local_588,poVar4,0xd,poVar5 + 0x80,0x20);
          bVar1 = hexEq(&local_588,"7260DA60138F96C9");
          if (bVar1 != 0) {
            pwd_len = strLen((char *)&local_5f8);
            poVar4 = beltH();
            beltPBKDF2((octet *)&local_588,(octet *)&local_5f8,pwd_len,10000,poVar4 + 0xc0,8);
            bVar1 = hexEq(&local_588,
                          "3D331BBBB1FBBB40E4BF22F6CB9A689EF13A77DC09ECF93291BFE42439A72E7D");
            if (bVar1 != 0) {
              poVar4 = beltH();
              poVar5 = beltH();
              beltCHEStart(local_438,poVar4 + 0x80,0x20,poVar5 + 0xc0);
              poVar4 = beltH();
              memCopy(&local_588,poVar4,0xf);
              beltCHEStepE(&local_588,0xf,local_438);
              poVar4 = beltH();
              beltCHEStepI(poVar4 + 0x10,0x20,local_438);
              beltCHEStepA(&local_588,0xf,local_438);
              beltCHEStepG(local_638,local_438);
              bVar1 = hexEq(&local_588,"BF3DAEAF5D18D2BCC30EA62D2E70A4");
              if (((bVar1 != 0) && (bVar1 = hexEq(local_638,"548622B844123FF7"), bVar1 != 0)) &&
                 (bVar1 = beltCHEStepV(local_638,local_438), bVar1 != 0)) {
                poVar4 = beltH();
                poVar5 = beltH();
                beltCHEStart(local_438,poVar4 + 0xa0,0x20,poVar5 + 0xd0);
                poVar4 = beltH();
                memCopy(&local_588,poVar4 + 0x40,0x14);
                poVar4 = beltH();
                beltCHEStepI(poVar4 + 0x50,0x20,local_438);
                beltCHEStepA(&local_588,0x14,local_438);
                beltCHEStepD(&local_588,0x14,local_438);
                beltCHEStepG(local_638,local_438);
                bVar1 = hexEq(&local_588,"2BABF43EB37B5398A9068F31A3C758B762F44AA9");
                if ((bVar1 != 0) && (bVar1 = hexEq(local_638,"7D9D4F59D40D197D"), bVar1 != 0)) {
                  poVar4 = beltH();
                  beltWBLStart(local_438,poVar4 + 0x80,0x20);
                  poVar4 = beltH();
                  memCopy(&local_588,poVar4,0x20);
                  poVar4 = beltH();
                  memCopy(local_588.p + 0x18,poVar4 + 0x20,0x10);
                  beltWBLStepE(&local_588,0x30,local_438);
                  bVar1 = hexEq(&local_588,
                                "49A38EE108D6C742E52B774F00A6EF98B106CBD13EA4FB0680323051BC04DF76E487B055C69BCF541176169F1DC9F6C8"
                               );
                  if (bVar1 != 0) {
                    poVar4 = beltH();
                    beltWBLStart(local_438,poVar4 + 0xa0,0x20);
                    poVar4 = beltH();
                    memCopy(&local_588,poVar4 + 0x40,0x30);
                    beltWBLStepD(&local_588,0x30,local_438);
                    bVar1 = hexEq(&local_588,
                                  "92632EE0C21AD9E09A39343E5C07DAA4889B03F2E6847EB152EC99F7A4D9F154"
                                 );
                    if ((bVar1 != 0) &&
                       (bVar1 = hexEq(local_588.p + 0x18,"B5EF68D8E4A39E567153DE13D72254EE"),
                       bVar1 != 0)) {
                      beltHashStart(local_438);
                      poVar4 = beltH();
                      beltHashStepH(poVar4,0xd,local_438);
                      beltHashStepG(local_638,local_438);
                      bVar1 = hexEq(local_638,
                                    "ABEF9725D4C5A83597A367D14494CC2542F20F659DDFECC961A3EC550CBA8C75"
                                   );
                      eVar3 = 0x20a;
                      if (bVar1 != 0) {
                        eVar3 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (eVar3 != 0) goto LAB_001080ff;
    }
    if ((tests & 8) != 0) {
      builtin_memcpy(local_648,"\x06\t*p",5);
      local_648[5] = '\x02';
      local_648[6] = '\0';
      local_648[7] = '\"';
      local_648[8] = 'e';
      local_648[9] = '\x1f';
      local_648[10] = 'Q';
      hexTo(local_5a8,"1F66B5B84B7339674533F0329C74F21834281FED0732429E0C79235FC273E269");
      prngEchoStart(local_438,local_5a8,0x20);
      eVar2 = bignParamsStd(&local_588,"1.2.112.0.2.0.34.101.45.3.1");
      eVar3 = 0x20a;
      if ((((eVar2 == 0) &&
           (eVar2 = bignKeypairGen(local_5a8,local_638,&local_588,prngEchoStepR,local_438),
           eVar2 == 0)) &&
          (bVar1 = hexEq(local_638,
                         "BD1A5650179D79E03FCEE49D4C2BD5DDF54CE46D0CF11E4FF87BF7A890857FD07AC6A60361E8C8173491686D461B2826190C2EDA5909054A9AB84D2AB9D99A90"
                        ), bVar1 != 0)) && (eVar2 = bignPubkeyVal(&local_588,local_638), eVar2 == 0)
         ) {
        poVar4 = beltH();
        eVar2 = beltHash(local_5c8,poVar4,0xd);
        if (((eVar2 == 0) &&
            (eVar2 = bignSign2((octet *)&local_5f8,&local_588,local_648,0xb,local_5c8,local_5a8,
                               (void *)0x0,0), eVar2 == 0)) &&
           ((bVar1 = hexEq(&local_5f8,
                           "19D32B7E01E25BAE4A70EB6BCA42602CCA6A13944451BCC5D4C54CFD8737619C328B8A58FB9C68FD17D569F7D06495FB"
                          ), bVar1 != 0 &&
            (eVar2 = bignVerify(&local_588,local_648,0xb,local_5c8,(octet *)&local_5f8,local_638),
            eVar2 == 0)))) {
          local_5f8 = local_5f8 ^ 1;
          eVar2 = bignVerify(&local_588,local_648,0xb,local_5c8,(octet *)&local_5f8,local_638);
          eVar3 = 0x20a;
          if (eVar2 != 0) {
            eVar3 = 0;
          }
        }
      }
      if (eVar3 != 0) goto LAB_001080ff;
    }
    if ((tests & 0x10) != 0) {
      poVar4 = beltH();
      memCopy(&local_588,poVar4,0x60);
      poVar4 = beltH();
      poVar5 = beltH();
      brngCTRStart(local_438,poVar4 + 0x80,poVar5 + 0xc0);
      brngCTRStepR(&local_588,0x60,local_438);
      bVar1 = hexEq(&local_588,
                    "1F66B5B84B7339674533F0329C74F21834281FED0732429E0C79235FC273E2694C0E74B2CD5811AD21F23DE7E0FA742C3ED6EC483C461CE15C33A77AA308B7D20F51D91347617C20BD4AB07AEF4F26A1AD1362A8F9A3D42FBE1B8E6F1C88AAD5"
                   );
      eVar3 = 0x20a;
      if (bVar1 == 0) goto LAB_001080ff;
    }
    eVar3 = 0;
  }
  else {
    bashHashStart(local_438,0x80);
    poVar4 = beltH();
    bashHashStepH(poVar4,0,local_438);
    bashHashStepG((octet *)&local_588,0x20,local_438);
    bVar1 = hexEq(&local_588,"114C3DFAE373D9BCBC3602D6386F2D6A2059BA1BF9048DBAA5146A6CB775709D");
    eVar3 = 0x20a;
    if (bVar1 != 0) {
      poVar4 = beltH();
      bashPrgStart(local_438,0x100,2,(octet *)0x0,0,poVar4,0x20);
      poVar4 = beltH();
      bashPrgAbsorb(poVar4 + 0x20,0x5f,local_438);
      bashPrgRatchet(local_438);
      bashPrgSqueeze(local_638,0x10,local_438);
      bVar1 = hexEq(local_638,"71CC358A0D5082173DE04803F7E905CB");
      if (bVar1 != 0) {
        poVar4 = beltH();
        bashPrgStart(local_438,0x80,1,poVar4 + 0x80,0x10,local_638,0x10);
        poVar4 = beltH();
        memCopy(&local_588,poVar4 + 0xa0,0x17);
        bashPrgEncr(&local_588,0x17,local_438);
        bVar1 = hexEq(&local_588,"51ED3B28D345FFD1AD22815B86ECC17C278C8FE8920214");
        if (bVar1 != 0) {
          poVar4 = beltH();
          bashPrgStart(local_438,0x80,1,poVar4 + 0x80,0x10,local_638,0x10);
          bashPrgDecr(&local_588,0x17,local_438);
          poVar4 = beltH();
          bVar1 = memEq(&local_588,poVar4 + 0xa0,0x17);
          eVar3 = 0x20a;
          if (bVar1 != 0) {
            eVar3 = 0;
          }
        }
      }
    }
    if (eVar3 == 0) goto LAB_00107a1c;
  }
LAB_001080ff:
  if (eVar3 != 0) {
    return eVar3;
  }
LAB_00108103:
  if ((((tests >> 0x18 & 1) == 0) || (eVar3 = cmdRngStart(1), eVar3 == 0)) &&
     (((tests >> 0x19 & 1) == 0 || (eVar3 = cmdStampSelfVal(), eVar3 == 0)))) {
    eVar3 = 0;
  }
  return eVar3;
}

Assistant:

err_t cmdStDo(u32 tests)
{
	err_t code = ERR_OK;
	// algs?
	if (tests & CMD_ST_ALGS)
	{
		code = cmdStAlgs(tests);
		ERR_CALL_CHECK(code);
	}
	// rng?
	if (tests & CMD_ST_RNG)
	{
		code = cmdRngStart(TRUE);
		ERR_CALL_CHECK(code);
	}
	// stamp?
	if (tests & CMD_ST_STAMP)
	{
		code = cmdStampSelfVal();
		ERR_CALL_CHECK(code);
	}
	return code;
}